

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void ** stb_array_block_alloc(int count,int blocksize)

{
  void **ppvVar1;
  void **ppvVar2;
  ulong uVar3;
  
  ppvVar1 = (void **)malloc((long)(blocksize * count) + (long)count * 8);
  if ((ppvVar1 != (void **)0x0) && (0 < count)) {
    ppvVar2 = ppvVar1 + count;
    uVar3 = 0;
    do {
      ppvVar1[uVar3] = ppvVar2;
      uVar3 = uVar3 + 1;
      ppvVar2 = (void **)((long)ppvVar2 + (long)blocksize);
    } while ((uint)count != uVar3);
  }
  return ppvVar1;
}

Assistant:

void **stb_array_block_alloc(int count, int blocksize)
{
   int i;
   char *p = (char *) malloc(sizeof(void *) * count + count * blocksize);
   void **q;
   if (p == NULL) return NULL;
   q = (void **) p;
   p += sizeof(void *) * count;
   for (i=0; i < count; ++i)
      q[i] = p + i * blocksize;
   return q;
}